

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O3

void __thiscall Kraken::KClient::KClient(KClient *this,string *key,string *secret)

{
  pointer pcVar1;
  EVP_PKEY_CTX *ctx;
  
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + key->_M_string_length);
  (this->secret_)._M_dataplus._M_p = (pointer)&(this->secret_).field_2;
  pcVar1 = (secret->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->secret_,pcVar1,pcVar1 + secret->_M_string_length);
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->url_,"https://api.kraken.com","")
  ;
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  ctx = (EVP_PKEY_CTX *)0x11d6bf;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->version_,"0","");
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient(const std::string& key, const std::string& secret)
   :key_(key), secret_(secret), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}